

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O1

void __thiscall CP::stack<int>::push(stack<int> *this,int *element)

{
  size_t sVar1;
  
  if (this->mCap < this->mSize + 1) {
    expand(this,this->mCap * 2);
  }
  sVar1 = this->mSize;
  this->mData[sVar1] = *element;
  this->mSize = sVar1 + 1;
  return;
}

Assistant:

void push(const T& element) {  // Theta(n)
      if (mSize + 1 > mCap) 
        expand(mCap * 2);
      mData[mSize] = element;
      mSize++;
    }